

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# param.cpp
# Opt level: O3

int __thiscall MeCab::Param::open(Param *this,char *__file,int __oflag,...)

{
  string *this_00;
  char cVar1;
  Param *pPVar2;
  int iVar3;
  long *plVar4;
  size_t sVar5;
  size_t sVar6;
  long *extraout_RAX;
  long *extraout_RAX_00;
  ulong uVar7;
  long *in_RCX;
  long *plVar8;
  size_type *psVar9;
  int iVar10;
  char *key;
  char *pcVar11;
  char cVar12;
  ostream *poVar13;
  char *pcVar14;
  ulong uVar15;
  long lVar16;
  undefined8 *puVar17;
  size_type __dnew;
  int local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  Param *local_c0;
  undefined8 *local_b8;
  long *local_b0;
  ulong local_a8;
  long local_a0;
  long lStack_98;
  long local_90;
  long *local_88;
  long local_80;
  long local_78;
  undefined2 local_70;
  undefined1 local_6e;
  long *local_68;
  long local_60;
  long local_58;
  long lStack_50;
  long *local_48;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_40;
  long local_38;
  
  iVar10 = (int)__file;
  if (iVar10 < 1) {
    uVar7 = std::__cxx11::string::_M_replace
                      ((ulong)&this->system_name_,0,(char *)(this->system_name_)._M_string_length,
                       0x15ced5);
LAB_00144afb:
    return (int)CONCAT71((int7)(uVar7 >> 8),1);
  }
  std::__cxx11::string::string((string *)&local_e0,(char *)*___oflag,(allocator *)&local_b0);
  std::__cxx11::string::operator=((string *)&this->system_name_,(string *)&local_e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p);
  }
  local_88 = &local_78;
  local_38 = 0xa2;
  local_b8 = ___oflag;
  plVar4 = (long *)std::__cxx11::string::_M_create((ulong *)&local_88,(ulong)&local_38);
  lVar16 = local_38;
  local_78 = local_38;
  local_88 = plVar4;
  memcpy(plVar4,
         "MeCab: Yet Another Part-of-Speech and Morphological Analyzer\n\nCopyright(C) 2001-2012 Taku Kudo \nCopyright(C) 2004-2008 Nippon Telegraph and Telephone Corporation\n"
         ,0xa2);
  local_80 = lVar16;
  *(undefined1 *)((long)plVar4 + lVar16) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_88);
  plVar8 = plVar4 + 2;
  if ((long *)*plVar4 == plVar8) {
    local_58 = *plVar8;
    lStack_50 = plVar4[3];
    local_68 = &local_58;
  }
  else {
    local_58 = *plVar8;
    local_68 = (long *)*plVar4;
  }
  local_60 = plVar4[1];
  *plVar4 = (long)plVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_68,(ulong)(this->system_name_)._M_dataplus._M_p);
  plVar8 = plVar4 + 2;
  if ((long *)*plVar4 == plVar8) {
    local_a0 = *plVar8;
    lStack_98 = plVar4[3];
    local_b0 = &local_a0;
  }
  else {
    local_a0 = *plVar8;
    local_b0 = (long *)*plVar4;
  }
  local_a8 = plVar4[1];
  *plVar4 = (long)plVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_b0);
  this_00 = &this->help_;
  psVar9 = (size_type *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    local_e0.field_2._M_allocated_capacity = *psVar9;
    local_e0.field_2._8_8_ = plVar4[3];
    local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
  }
  else {
    local_e0.field_2._M_allocated_capacity = *psVar9;
    local_e0._M_dataplus._M_p = (pointer)*plVar4;
  }
  local_e0._M_string_length = plVar4[1];
  *plVar4 = (long)psVar9;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  std::__cxx11::string::operator=((string *)this_00,(string *)&local_e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p);
  }
  if (local_b0 != &local_a0) {
    operator_delete(local_b0);
  }
  if (local_68 != &local_58) {
    operator_delete(local_68);
  }
  if (local_88 != &local_78) {
    operator_delete(local_88);
  }
  local_78 = 0x61746a5f6e65706f;
  local_70 = 0x6b6c;
  local_80 = 10;
  local_6e = 0;
  local_88 = &local_78;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_88);
  plVar8 = plVar4 + 2;
  if ((long *)*plVar4 == plVar8) {
    local_58 = *plVar8;
    lStack_50 = plVar4[3];
    local_68 = &local_58;
  }
  else {
    local_58 = *plVar8;
    local_68 = (long *)*plVar4;
  }
  local_60 = plVar4[1];
  *plVar4 = (long)plVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_68);
  plVar8 = plVar4 + 2;
  if ((long *)*plVar4 == plVar8) {
    local_a0 = *plVar8;
    lStack_98 = plVar4[3];
    local_b0 = &local_a0;
  }
  else {
    local_a0 = *plVar8;
    local_b0 = (long *)*plVar4;
  }
  local_a8 = plVar4[1];
  *plVar4 = (long)plVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::_M_replace_aux((ulong)&local_b0,local_a8,0,'\x01');
  psVar9 = (size_type *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    local_e0.field_2._M_allocated_capacity = *psVar9;
    local_e0.field_2._8_8_ = plVar4[3];
    local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
  }
  else {
    local_e0.field_2._M_allocated_capacity = *psVar9;
    local_e0._M_dataplus._M_p = (pointer)*plVar4;
  }
  local_e0._M_string_length = plVar4[1];
  *plVar4 = (long)psVar9;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  std::__cxx11::string::operator=((string *)&this->version_,(string *)&local_e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p);
  }
  if (local_b0 != &local_a0) {
    operator_delete(local_b0);
  }
  local_c0 = this;
  if (local_68 != &local_58) {
    operator_delete(local_68);
  }
  if (local_88 != &local_78) {
    operator_delete(local_88);
  }
  pcVar11 = (char *)*in_RCX;
  cVar12 = (char)this_00;
  if (pcVar11 != (char *)0x0) {
    uVar7 = 0;
    pcVar14 = pcVar11;
    plVar4 = in_RCX;
    do {
      sVar5 = strlen(pcVar14);
      if ((char *)plVar4[3] == (char *)0x0) {
        uVar15 = sVar5 + 1;
      }
      else {
        sVar6 = strlen((char *)plVar4[3]);
        uVar15 = sVar5 + sVar6 + 2;
      }
      if (uVar7 < uVar15) {
        uVar7 = uVar15;
      }
      pcVar14 = (char *)plVar4[5];
      plVar4 = plVar4 + 5;
    } while (pcVar14 != (char *)0x0);
    lVar16 = 0;
    do {
      sVar5 = strlen(pcVar11);
      if ((char *)in_RCX[lVar16 * 5 + 3] != (char *)0x0) {
        sVar6 = strlen((char *)in_RCX[lVar16 * 5 + 3]);
        sVar5 = sVar5 + sVar6 + 1;
      }
      std::__cxx11::string::append((char *)this_00);
      std::__cxx11::string::push_back(cVar12);
      std::__cxx11::string::append((char *)this_00);
      std::__cxx11::string::append((char *)this_00);
      if (in_RCX[lVar16 * 5 + 3] != 0) {
        std::__cxx11::string::push_back(cVar12);
        std::__cxx11::string::append((char *)this_00);
      }
      for (; sVar5 <= uVar7; sVar5 = sVar5 + 1) {
        std::__cxx11::string::push_back(cVar12);
      }
      std::__cxx11::string::append((char *)this_00);
      std::__cxx11::string::push_back(cVar12);
      lVar16 = lVar16 + 1;
      pcVar11 = (char *)in_RCX[lVar16 * 5];
    } while (pcVar11 != (char *)0x0);
  }
  plVar4 = (long *)std::__cxx11::string::push_back(cVar12);
  pPVar2 = local_c0;
  pcVar11 = (char *)*in_RCX;
  if (pcVar11 != (char *)0x0) {
    plVar4 = in_RCX;
    plVar8 = in_RCX;
    do {
      if ((char *)plVar8[2] != (char *)0x0) {
        std::__cxx11::string::string((string *)&local_e0,(char *)plVar8[2],(allocator *)&local_b0);
        set<std::__cxx11::string>(pPVar2,pcVar11,&local_e0,true);
        plVar4 = extraout_RAX;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
          operator_delete(local_e0._M_dataplus._M_p);
          plVar4 = extraout_RAX_00;
        }
      }
      pcVar11 = (char *)plVar8[5];
      plVar8 = plVar8 + 5;
    } while (pcVar11 != (char *)0x0);
  }
  if (iVar10 == 1) {
    return (int)CONCAT71((int7)((ulong)plVar4 >> 8),1);
  }
  local_40 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&pPVar2->rest_;
  local_48 = in_RCX + 5;
  uVar7 = 1;
  puVar17 = local_b8;
LAB_00144f8e:
  pPVar2 = local_c0;
  local_e8 = (int)uVar7;
  lVar16 = (long)local_e8;
  pcVar11 = (char *)puVar17[lVar16];
  if (*pcVar11 == '-') {
    cVar12 = pcVar11[1];
    uVar7 = 0;
    if (cVar12 == '\0') goto LAB_00145009;
    local_90 = lVar16;
    if (cVar12 != '-') {
      key = (char *)*in_RCX;
      if (key == (char *)0x0) {
LAB_00145263:
        poVar13 = (ostream *)&local_c0->what_;
        std::__ostream_insert<char,std::char_traits<char>>(poVar13,"unrecognized option `",0x15);
        pcVar11 = (char *)local_b8[local_90];
        if (pcVar11 == (char *)0x0) {
          std::ios::clear((int)poVar13 + (int)*(undefined8 *)(*(long *)poVar13 + -0x18));
        }
        else {
          sVar5 = strlen(pcVar11);
          std::__ostream_insert<char,std::char_traits<char>>(poVar13,pcVar11,sVar5);
        }
        pcVar11 = "`";
        lVar16 = 1;
        goto LAB_001452d4;
      }
      cVar1 = (char)in_RCX[1];
      plVar4 = in_RCX;
      while (cVar1 != cVar12) {
        key = (char *)plVar4[5];
        if (key == (char *)0x0) goto LAB_00145263;
        cVar1 = (char)plVar4[6];
        plVar4 = plVar4 + 5;
      }
      if (plVar4[3] == 0) {
        if (pcVar11[2] == '\0') {
          goto LAB_00145208;
        }
LAB_001452ed:
        puVar17 = local_b8;
        poVar13 = (ostream *)&local_c0->what_;
        std::__ostream_insert<char,std::char_traits<char>>(poVar13,"`",1);
        pcVar11 = (char *)puVar17[local_90];
        if (pcVar11 == (char *)0x0) {
          std::ios::clear((int)*(undefined8 *)(*(long *)poVar13 + -0x18) + (int)poVar13);
        }
        else {
          sVar5 = strlen(pcVar11);
          std::__ostream_insert<char,std::char_traits<char>>(poVar13,pcVar11,sVar5);
        }
        pcVar11 = "` doesn\'t allow an argument";
        lVar16 = 0x1b;
LAB_001452d4:
        std::__ostream_insert<char,std::char_traits<char>>(poVar13,pcVar11,lVar16);
        return 0;
      }
      puVar17 = local_b8;
      if (pcVar11[2] == '\0') {
        local_e8 = local_e8 + 1;
        if (local_e8 == iVar10) goto LAB_0014532e;
        std::__cxx11::string::string
                  ((string *)&local_e0,(char *)local_b8[local_e8],(allocator *)&local_b0);
        set<std::__cxx11::string>(pPVar2,key,&local_e0,true);
      }
      else {
        pcVar11 = pcVar11 + 2;
        local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
        sVar5 = strlen(pcVar11);
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,pcVar11,pcVar11 + sVar5)
        ;
        set<std::__cxx11::string>(pPVar2,key,&local_e0,true);
      }
      goto LAB_00144ffa;
    }
    sVar5 = 0;
    for (pcVar14 = pcVar11 + 3; (cVar12 = pcVar14[-1], cVar12 != '\0' && (cVar12 != '='));
        pcVar14 = pcVar14 + 1) {
      sVar5 = sVar5 + 1;
    }
    if (sVar5 == 0) goto LAB_00144afb;
    key = (char *)*in_RCX;
    plVar4 = local_48;
    while( true ) {
      if (key == (char *)0x0) goto LAB_00145263;
      sVar6 = strlen(key);
      if ((sVar6 == sVar5) &&
         (iVar3 = strncmp(pcVar11 + 2,key,sVar5), puVar17 = local_b8, pPVar2 = local_c0, iVar3 == 0)
         ) break;
      key = (char *)*plVar4;
      plVar4 = plVar4 + 5;
    }
    if (plVar4[-2] == 0) {
      if (cVar12 == '=') goto LAB_001452ed;
LAB_00145208:
      puVar17 = local_b8;
      local_e0._M_dataplus._M_p._0_4_ = 1;
      set<int>(local_c0,key,(int *)&local_e0,true);
      goto LAB_00145009;
    }
    if (cVar12 == '=') {
      local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
      sVar5 = strlen(pcVar14);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,pcVar14,pcVar14 + sVar5);
      set<std::__cxx11::string>(local_c0,key,&local_e0,true);
    }
    else {
      local_e8 = local_e8 + 1;
      if (local_e8 == iVar10) {
LAB_0014532e:
        puVar17 = local_b8;
        poVar13 = (ostream *)&local_c0->what_;
        std::__ostream_insert<char,std::char_traits<char>>(poVar13,"`",1);
        pcVar11 = (char *)puVar17[local_90];
        if (pcVar11 == (char *)0x0) {
          std::ios::clear((int)*(undefined8 *)(*(long *)poVar13 + -0x18) + (int)poVar13);
        }
        else {
          sVar5 = strlen(pcVar11);
          std::__ostream_insert<char,std::char_traits<char>>(poVar13,pcVar11,sVar5);
        }
        pcVar11 = "` requires an argument";
        lVar16 = 0x16;
        goto LAB_001452d4;
      }
      std::__cxx11::string::string
                ((string *)&local_e0,(char *)local_b8[local_e8],(allocator *)&local_b0);
      set<std::__cxx11::string>(pPVar2,key,&local_e0,true);
    }
  }
  else {
    std::__cxx11::string::string((string *)&local_e0,pcVar11,(allocator *)&local_b0);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>(local_40,&local_e0);
  }
LAB_00144ffa:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p);
  }
LAB_00145009:
  uVar7 = (ulong)(local_e8 + 1U);
  if (iVar10 <= (int)(local_e8 + 1U)) goto LAB_00144afb;
  goto LAB_00144f8e;
}

Assistant:

bool Param::open(int argc, char **argv, const Option *opts) {
  int ind = 0;
  int _errno = 0;

#define GOTO_ERROR(n) {                         \
    _errno = n;                                 \
    goto ERROR; } while (0)

  if (argc <= 0) {
    system_name_ = "unknown";
    return true;  // this is not error
  }

  system_name_ = std::string(argv[0]);

  init_param(&help_, &version_, system_name_, opts);

  for (size_t i = 0; opts[i].name; ++i) {
    if (opts[i].default_value) set<std::string>
                                   (opts[i].name, opts[i].default_value);
  }

  for (ind = 1; ind < argc; ind++) {
    if (argv[ind][0] == '-') {
      // long options
      if (argv[ind][1] == '-') {
        char *s;
        for (s = &argv[ind][2]; *s != '\0' && *s != '='; s++);
        size_t len = (size_t)(s - &argv[ind][2]);
        if (len == 0) return true;  // stop the scanning

        bool hit = false;
        size_t i = 0;
        for (i = 0; opts[i].name; ++i) {
          size_t nlen = std::strlen(opts[i].name);
          if (nlen == len && std::strncmp(&argv[ind][2],
                                          opts[i].name, len) == 0) {
            hit = true;
            break;
          }
        }

        if (!hit) GOTO_ERROR(0);

        if (opts[i].arg_description) {
          if (*s == '=') {
            set<std::string>(opts[i].name, s+1);
          } else {
            if (argc == (ind+1)) GOTO_ERROR(1);
            set<std::string>(opts[i].name, argv[++ind]);
          }
        } else {
          if (*s == '=') GOTO_ERROR(2);
          set<int>(opts[i].name, 1);
        }

        // short options
      } else if (argv[ind][1] != '\0') {
        size_t i = 0;
        bool hit = false;
        for (i = 0; opts[i].name; ++i) {
          if (opts[i].short_name == argv[ind][1]) {
            hit = true;
            break;
          }
        }

        if (!hit) GOTO_ERROR(0);

        if (opts[i].arg_description) {
          if (argv[ind][2] != '\0') {
            set<std::string>(opts[i].name, &argv[ind][2]);
          } else {
            if (argc == (ind+1)) GOTO_ERROR(1);
            set<std::string>(opts[i].name, argv[++ind]);
          }
        } else {
          if (argv[ind][2] != '\0') GOTO_ERROR(2);
          set<int>(opts[i].name, 1);
        }
      }
    } else {
      rest_.push_back(std::string(argv[ind]));  // others
    }
  }

  return true;

ERROR:
  switch (_errno) {
    case 0: WHAT << "unrecognized option `" << argv[ind] << "`"; break;
    case 1: WHAT << "`" << argv[ind] << "` requires an argument";  break;
    case 2: WHAT << "`" << argv[ind] << "` doesn't allow an argument"; break;
  }
  return false;
}